

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
ArgsManager::GetChainArg_abi_cxx11_
          (variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ArgsManager *this)

{
  _Alloc_hider _Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  optional<ChainType> oVar6;
  runtime_error *this_00;
  long in_FS_OFFSET;
  string_view chain;
  anon_class_8_1_8991fb9c get_net;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  chain_arg;
  anon_class_8_1_8991fb9c local_88;
  string local_80;
  undefined1 local_60 [32];
  bool local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_p = local_60 + 0x10;
  local_88.this = this;
  local_60._0_8_ = _Var1._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"-regtest","");
  bVar2 = GetChainArg::anon_class_8_1_8991fb9c::operator()(&local_88,(string *)local_60);
  if ((pointer)local_60._0_8_ != _Var1._M_p) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  local_60._0_8_ = _Var1._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"-signet","");
  bVar3 = GetChainArg::anon_class_8_1_8991fb9c::operator()(&local_88,(string *)local_60);
  if ((pointer)local_60._0_8_ != _Var1._M_p) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  local_60._0_8_ = _Var1._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"-testnet","");
  bVar4 = GetChainArg::anon_class_8_1_8991fb9c::operator()(&local_88,(string *)local_60);
  if ((pointer)local_60._0_8_ != _Var1._M_p) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  local_60._0_8_ = _Var1._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"-testnet4","");
  bVar5 = GetChainArg::anon_class_8_1_8991fb9c::operator()(&local_88,(string *)local_60);
  if ((pointer)local_60._0_8_ != _Var1._M_p) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"-chain","");
  GetArg((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_60,this,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (1 < (uint)bVar5 + (uint)bVar4 + (uint)bVar3 + (uint)bVar2 + (uint)local_40) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "Invalid combination of -regtest, -signet, -testnet, -testnet4 and -chain. Can use at most one."
              );
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_0069eafd;
  }
  if (local_40 == false) {
    if (bVar2) {
      *(undefined4 *)
       &(__return_storage_ptr__->
        super__Variant_base<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super__Move_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<ChainType,_std::__cxx11::basic_string<char>_>._M_u = 3;
    }
    else if (bVar3) {
      *(undefined4 *)
       &(__return_storage_ptr__->
        super__Variant_base<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super__Move_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<ChainType,_std::__cxx11::basic_string<char>_>._M_u = 2;
    }
    else if (bVar4) {
      *(undefined4 *)
       &(__return_storage_ptr__->
        super__Variant_base<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super__Move_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<ChainType,_std::__cxx11::basic_string<char>_>._M_u = 1;
    }
    else if (bVar5) {
      *(undefined4 *)
       &(__return_storage_ptr__->
        super__Variant_base<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super__Move_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<ChainType,_std::__cxx11::basic_string<char>_>._M_u = 4;
    }
    else {
      *(undefined4 *)
       &(__return_storage_ptr__->
        super__Variant_base<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super__Move_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<ChainType,_std::__cxx11::basic_string<char>_>._M_u = 0;
    }
LAB_0069e9ae:
    (__return_storage_ptr__->
    super__Variant_base<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).super__Move_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<ChainType,_std::__cxx11::basic_string<char>_>._M_index = '\0';
  }
  else {
    chain._M_str = (char *)local_60._0_8_;
    chain._M_len = local_60._8_8_;
    oVar6 = ChainTypeFromString(chain);
    if (((ulong)oVar6.super__Optional_base<ChainType,_true,_true>._M_payload.
                super__Optional_payload_base<ChainType> >> 0x20 & 1) != 0) {
      *(ChainType *)
       &(__return_storage_ptr__->
        super__Variant_base<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).super__Move_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<ChainType,_std::__cxx11::basic_string<char>_>._M_u =
           oVar6.super__Optional_base<ChainType,_true,_true>._M_payload.
           super__Optional_payload_base<ChainType>._M_payload;
      goto LAB_0069e9ae;
    }
    *(undefined1 **)
     &(__return_storage_ptr__->
      super__Variant_base<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super__Move_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
      super__Copy_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
      super__Move_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
      super__Copy_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
      super__Variant_storage_alias<ChainType,_std::__cxx11::basic_string<char>_>._M_u =
         (undefined1 *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).super__Move_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
                 super__Copy_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
                 super__Move_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
                 super__Copy_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
                 super__Variant_storage_alias<ChainType,_std::__cxx11::basic_string<char>_>._M_u +
         0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_60._0_8_,
               (char *)(local_60._8_8_ + local_60._0_8_));
    (__return_storage_ptr__->
    super__Variant_base<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).super__Move_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<ChainType,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<ChainType,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<ChainType,_std::__cxx11::basic_string<char>_>._M_index = '\x01';
  }
  if (local_40 == true) {
    local_40 = false;
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0069eafd:
  __stack_chk_fail();
}

Assistant:

std::variant<ChainType, std::string> ArgsManager::GetChainArg() const
{
    auto get_net = [&](const std::string& arg) {
        LOCK(cs_args);
        common::SettingsValue value = common::GetSetting(m_settings, /* section= */ "", SettingName(arg),
            /* ignore_default_section_config= */ false,
            /*ignore_nonpersistent=*/false,
            /* get_chain_type= */ true);
        return value.isNull() ? false : value.isBool() ? value.get_bool() : InterpretBool(value.get_str());
    };

    const bool fRegTest = get_net("-regtest");
    const bool fSigNet  = get_net("-signet");
    const bool fTestNet = get_net("-testnet");
    const bool fTestNet4 = get_net("-testnet4");
    const auto chain_arg = GetArg("-chain");

    if ((int)chain_arg.has_value() + (int)fRegTest + (int)fSigNet + (int)fTestNet + (int)fTestNet4 > 1) {
        throw std::runtime_error("Invalid combination of -regtest, -signet, -testnet, -testnet4 and -chain. Can use at most one.");
    }
    if (chain_arg) {
        if (auto parsed = ChainTypeFromString(*chain_arg)) return *parsed;
        // Not a known string, so return original string
        return *chain_arg;
    }
    if (fRegTest) return ChainType::REGTEST;
    if (fSigNet) return ChainType::SIGNET;
    if (fTestNet) return ChainType::TESTNET;
    if (fTestNet4) return ChainType::TESTNET4;
    return ChainType::MAIN;
}